

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-term.c
# Opt level: O3

errr Term_inkey(ui_event *ch,_Bool wait,_Bool take)

{
  uint8_t uVar1;
  ui_event *puVar2;
  mouseclick mVar3;
  errr eVar4;
  term *ptVar5;
  uint16_t uVar6;
  ulong uVar7;
  ushort uVar8;
  uint uVar9;
  
  *(undefined4 *)&(ch->key).mods = 0;
  *(ui_event_type *)ch = EVT_NONE;
  *(uint8_t *)((long)ch + 4) = '\0';
  *(uint8_t *)((long)ch + 5) = '\0';
  *(uint8_t *)((long)ch + 6) = '\0';
  *(uint8_t *)((long)ch + 7) = '\0';
  if ((Term->never_bored == false) && (Term->xtra_hook != (_func_errr_wchar_t_wchar_t *)0x0)) {
    (*Term->xtra_hook)(L'\t',L'\0');
  }
  uVar8 = Term->key_head;
  uVar7 = (ulong)Term->key_tail;
  ptVar5 = Term;
  if (wait) {
    while (uVar8 == (ushort)uVar7) {
      if (ptVar5->xtra_hook != (_func_errr_wchar_t_wchar_t *)0x0) {
        (*ptVar5->xtra_hook)(L'\x01',L'\x01');
        ptVar5 = Term;
      }
      uVar7 = (ulong)ptVar5->key_tail;
      uVar8 = ptVar5->key_head;
    }
  }
  else if (uVar8 == Term->key_tail) {
    if (Term->xtra_hook == (_func_errr_wchar_t_wchar_t *)0x0) {
      return 1;
    }
    (*Term->xtra_hook)(L'\x01',L'\0');
    uVar8 = Term->key_head;
    uVar7 = (ulong)Term->key_tail;
    ptVar5 = Term;
  }
  eVar4 = 1;
  if (uVar8 != (ushort)uVar7) {
    puVar2 = ptVar5->key_queue;
    *(undefined4 *)&(ch->key).mods = *(undefined4 *)((long)puVar2 + uVar7 * 0xc + 8);
    mVar3 = puVar2[uVar7].mouse;
    ch->mouse = mVar3;
    if ((ulong)mVar3 >> 0x20 != 0 && mVar3.type == EVT_KBRD) {
      uVar1 = (ch->key).mods;
      *(mouseclick *)(keylog + log_i) = mVar3;
      keylog[log_i].mods = uVar1;
      if (log_size < L'\b') {
        log_size = log_size + L'\x01';
      }
      uVar9 = log_i + L'\b';
      if (-1 < log_i + L'\x01') {
        uVar9 = log_i + L'\x01';
      }
      log_i = (log_i - (uVar9 & 0xfffffff8)) + L'\x01';
    }
    eVar4 = 0;
    if (take) {
      uVar6 = ptVar5->key_tail + 1;
      eVar4 = 0;
      if (uVar6 == ptVar5->key_size) {
        uVar6 = 0;
      }
      ptVar5->key_tail = uVar6;
    }
  }
  return eVar4;
}

Assistant:

errr Term_inkey(ui_event *ch, bool wait, bool take)
{
	/* Assume no key */
	memset(ch, 0, sizeof *ch);

	/* Hack -- get bored */
	if (!Term->never_bored)
		/* Process random events */
		Term_xtra(TERM_XTRA_BORED, 0);

	/* Wait or not */
	if (wait)
		/* Process pending events while necessary */
		while (Term->key_head == Term->key_tail)
			/* Process events (wait for one) */
			Term_xtra(TERM_XTRA_EVENT, true);
	else
		/* Process pending events if necessary */
		if (Term->key_head == Term->key_tail)
			/* Process events (do not wait) */
			Term_xtra(TERM_XTRA_EVENT, false);

	/* No keys are ready */
	if (Term->key_head == Term->key_tail) return (1);

	/* Extract the next keypress */
	(*ch) = Term->key_queue[Term->key_tail];

	/* sketchy key loggin */
	log_keypress(*ch);

	/* If requested, advance the queue, wrap around if necessary */
	if (take && (++Term->key_tail == Term->key_size)) Term->key_tail = 0;

	/* Success */
	return (0);
}